

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDefinition.cpp
# Opt level: O3

void __thiscall
Rml::ElementDefinition::ElementDefinition
          (ElementDefinition *this,Vector<const_StyleSheetNode_*> *style_sheet_nodes)

{
  NodePtr pDVar1;
  ulong uVar2;
  ulong *puVar3;
  pointer ppSVar4;
  PropertyDictionary *other;
  PropertyMap *this_00;
  pair<Rml::PropertyId,_Rml::Property> *property;
  NodePtr pDVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong *puVar8;
  const_iterator cVar9;
  
  PropertyDictionary::PropertyDictionary(&this->properties);
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  ppSVar4 = (style_sheet_nodes->
            super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((style_sheet_nodes->
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar4) {
    uVar6 = 0;
    do {
      other = StyleSheetNode::GetProperties(ppSVar4[uVar6]);
      PropertyDictionary::Merge(&this->properties,other,0);
      uVar6 = uVar6 + 1;
      ppSVar4 = (style_sheet_nodes->
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(style_sheet_nodes->
                                   super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  this_00 = PropertyDictionary::GetProperties(&this->properties);
  cVar9 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::cbegin(this_00);
  pDVar1 = (NodePtr)this_00->mInfo;
  if (cVar9.mKeyVals != pDVar1) {
    do {
      puVar7 = cVar9.mInfo;
      PropertyIdSet::Insert(&this->property_ids,((cVar9.mKeyVals)->mData).first);
      pDVar5 = cVar9.mKeyVals + 1;
      uVar6 = *(ulong *)(puVar7 + 1);
      if (uVar6 == 0) {
        puVar3 = (ulong *)(puVar7 + 9);
        do {
          puVar8 = puVar3;
          pDVar5 = pDVar5 + 8;
          uVar6 = *puVar8;
          puVar3 = puVar8 + 1;
        } while (uVar6 == 0);
      }
      else {
        puVar8 = (ulong *)(puVar7 + 1);
      }
      uVar2 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar6 = uVar2 >> 3 & 0x1fffffff;
      cVar9.mInfo = (uint8_t *)((long)puVar8 + uVar6);
      cVar9.mKeyVals = pDVar5 + uVar6;
    } while (pDVar5 + uVar6 != pDVar1);
  }
  return;
}

Assistant:

ElementDefinition::ElementDefinition(const Vector<const StyleSheetNode*>& style_sheet_nodes)
{
	// Initialises the element definition from the list of style sheet nodes.
	for (size_t i = 0; i < style_sheet_nodes.size(); ++i)
		properties.Merge(style_sheet_nodes[i]->GetProperties());

	for (auto& property : properties.GetProperties())
		property_ids.Insert(property.first);
}